

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::tabbed_display::set_tab_name(tabbed_display *this,unsigned_long idx,ustring *new_name)

{
  auto_mutex M;
  unsigned_long height;
  
  M.r = (this->super_drawable).m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  _M_assign(&(this->tabs).array_elements[idx].name,new_name);
  font::compute_size<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
            ((this->super_drawable).mfont.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,new_name,&(this->tabs).array_elements[idx].width,&height,0,0xffffffffffffffff);
  recompute_tabs(this);
  base_window::invalidate_rectangle
            (&((this->super_drawable).parent)->super_base_window,&(this->super_drawable).rect);
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

void tabbed_display::
    set_tab_name (
        unsigned long idx,
        const dlib::ustring& new_name
    )
    {
        auto_mutex M(m);


        DLIB_ASSERT ( idx < number_of_tabs() ,
                "\tvoid tabbed_display::set_tab_name()"
                << "\n\tidx:              " << idx 
                << "\n\tnumber_of_tabs(): " << number_of_tabs() );


        tabs[idx].name = new_name;
        // do this so that there isn't any reference counting going on
        tabs[idx].name[0] = tabs[idx].name[0];
        unsigned long height;
        mfont->compute_size(new_name,tabs[idx].width,height);


        recompute_tabs();

        parent.invalidate_rectangle(rect);
    }